

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_strfmt.c
# Opt level: O1

char * lj_strfmt_pushvf(lua_State *L,char *fmt,__va_list_tag *argp)

{
  SBuf *sb;
  uint uVar1;
  undefined4 uVar2;
  TValue *pTVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  long *plVar7;
  lua_Number *plVar8;
  undefined4 *puVar9;
  undefined8 *puVar10;
  char *pcVar11;
  GCstr *pGVar12;
  uint *puVar13;
  int *piVar14;
  MSize len;
  uint64_t k;
  ulong uVar15;
  FormatState fs;
  FormatState local_50;
  
  uVar15 = (ulong)(L->glref).ptr32;
  *(int *)(uVar15 + 0xf4) = (int)L;
  *(undefined4 *)(uVar15 + 0xe8) = *(undefined4 *)(uVar15 + 0xf0);
  sVar6 = strlen(fmt);
  local_50.e = (uint8_t *)(fmt + (sVar6 & 0xffffffff));
  local_50.p = (uint8_t *)fmt;
  uVar5 = lj_strfmt_parse(&local_50);
  if (uVar5 != 0) {
    sb = (SBuf *)(uVar15 + 0xe8);
    do {
      switch(uVar5 & 0xf) {
      case 2:
        pcVar11 = local_50.str;
        len = local_50.len;
        goto LAB_00113f75;
      case 3:
        uVar1 = argp->gp_offset;
        if ((ulong)uVar1 < 0x29) {
          piVar14 = (int *)((ulong)uVar1 + (long)argp->reg_save_area);
          argp->gp_offset = uVar1 + 8;
        }
        else {
          piVar14 = (int *)argp->overflow_arg_area;
          argp->overflow_arg_area = piVar14 + 2;
        }
        k = (uint64_t)*piVar14;
        goto LAB_00113fbd;
      case 4:
        uVar1 = argp->gp_offset;
        if ((ulong)uVar1 < 0x29) {
          puVar13 = (uint *)((ulong)uVar1 + (long)argp->reg_save_area);
          argp->gp_offset = uVar1 + 8;
        }
        else {
          puVar13 = (uint *)argp->overflow_arg_area;
          argp->overflow_arg_area = puVar13 + 2;
        }
        k = (uint64_t)*puVar13;
LAB_00113fbd:
        lj_strfmt_putfxint(sb,uVar5,k);
        break;
      case 5:
        uVar5 = argp->fp_offset;
        if ((ulong)uVar5 < 0xa1) {
          plVar8 = (lua_Number *)((ulong)uVar5 + (long)argp->reg_save_area);
          argp->fp_offset = uVar5 + 0x10;
        }
        else {
          plVar8 = (lua_Number *)argp->overflow_arg_area;
          argp->overflow_arg_area = plVar8 + 1;
        }
        lj_strfmt_putfnum(sb,0xf000035,*plVar8);
        break;
      case 6:
        uVar5 = argp->gp_offset;
        if ((ulong)uVar5 < 0x29) {
          plVar7 = (long *)((ulong)uVar5 + (long)argp->reg_save_area);
          argp->gp_offset = uVar5 + 8;
        }
        else {
          plVar7 = (long *)argp->overflow_arg_area;
          argp->overflow_arg_area = plVar7 + 1;
        }
        pcVar11 = (char *)*plVar7;
        if (pcVar11 == (char *)0x0) {
          pcVar11 = "(null)";
        }
        sVar6 = strlen(pcVar11);
        len = (MSize)sVar6;
LAB_00113f75:
        lj_buf_putmem(sb,pcVar11,len);
        break;
      case 7:
        uVar5 = argp->gp_offset;
        if ((ulong)uVar5 < 0x29) {
          puVar9 = (undefined4 *)((ulong)uVar5 + (long)argp->reg_save_area);
          argp->gp_offset = uVar5 + 8;
        }
        else {
          puVar9 = (undefined4 *)argp->overflow_arg_area;
          argp->overflow_arg_area = puVar9 + 2;
        }
        uVar2 = *puVar9;
        pcVar11 = (char *)(ulong)*(uint *)(uVar15 + 0xe8);
        if (*(uint *)(uVar15 + 0xec) == *(uint *)(uVar15 + 0xe8)) {
          pcVar11 = lj_buf_more2(sb,1);
        }
        iVar4 = (int)pcVar11;
        *pcVar11 = (char)uVar2;
        goto LAB_00113fec;
      case 8:
        uVar5 = argp->gp_offset;
        if ((ulong)uVar5 < 0x29) {
          puVar10 = (undefined8 *)((ulong)uVar5 + (long)argp->reg_save_area);
          argp->gp_offset = uVar5 + 8;
        }
        else {
          puVar10 = (undefined8 *)argp->overflow_arg_area;
          argp->overflow_arg_area = puVar10 + 1;
        }
        lj_strfmt_putptr(sb,(void *)*puVar10);
        break;
      default:
        pcVar11 = (char *)(ulong)*(uint *)(uVar15 + 0xe8);
        if (*(uint *)(uVar15 + 0xec) == *(uint *)(uVar15 + 0xe8)) {
          pcVar11 = lj_buf_more2(sb,1);
        }
        iVar4 = (int)pcVar11;
        *pcVar11 = '?';
LAB_00113fec:
        (sb->p).ptr32 = iVar4 + 1;
      }
      uVar5 = lj_strfmt_parse(&local_50);
    } while (uVar5 != 0);
  }
  pGVar12 = lj_str_new(L,(char *)(ulong)*(uint *)(uVar15 + 0xf0),
                       (ulong)(*(int *)(uVar15 + 0xe8) - *(uint *)(uVar15 + 0xf0)));
  pTVar3 = L->top;
  (pTVar3->u32).lo = (uint32_t)pGVar12;
  (pTVar3->field_2).it = 0xfffffffb;
  pTVar3 = L->top;
  L->top = pTVar3 + 1;
  if ((TValue *)(ulong)(L->maxstack).ptr32 <= pTVar3 + 1) {
    lj_state_growstack1(L);
  }
  return (char *)(pGVar12 + 1);
}

Assistant:

const char *lj_strfmt_pushvf(lua_State *L, const char *fmt, va_list argp)
{
  SBuf *sb = lj_buf_tmp_(L);
  FormatState fs;
  SFormat sf;
  GCstr *str;
  lj_strfmt_init(&fs, fmt, (MSize)strlen(fmt));
  while ((sf = lj_strfmt_parse(&fs)) != STRFMT_EOF) {
    switch (STRFMT_TYPE(sf)) {
    case STRFMT_LIT:
      lj_buf_putmem(sb, fs.str, fs.len);
      break;
    case STRFMT_INT:
      lj_strfmt_putfxint(sb, sf, va_arg(argp, int32_t));
      break;
    case STRFMT_UINT:
      lj_strfmt_putfxint(sb, sf, va_arg(argp, uint32_t));
      break;
    case STRFMT_NUM:
      lj_strfmt_putfnum(sb, STRFMT_G14, va_arg(argp, lua_Number));
      break;
    case STRFMT_STR: {
      const char *s = va_arg(argp, char *);
      if (s == NULL) s = "(null)";
      lj_buf_putmem(sb, s, (MSize)strlen(s));
      break;
      }
    case STRFMT_CHAR:
      lj_buf_putb(sb, va_arg(argp, int));
      break;
    case STRFMT_PTR:
      lj_strfmt_putptr(sb, va_arg(argp, void *));
      break;
    case STRFMT_ERR:
    default:
      lj_buf_putb(sb, '?');
      lj_assertL(0, "bad string format near offset %d", fs.len);
      break;
    }
  }
  str = lj_buf_str(L, sb);
  setstrV(L, L->top, str);
  incr_top(L);
  return strdata(str);
}